

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringalgorithms_p.h
# Opt level: O0

QString * QStringAlgorithms<QString>::trimmed_helper(QString *str)

{
  long lVar1;
  bool bVar2;
  QString *pQVar3;
  NakedStringType *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  TrimPositions TVar4;
  Char *begin;
  QString *end;
  QString *begin_00;
  QString *unicode;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  end = in_RDI;
  unicode = in_RDI;
  TVar4 = trimmed_helper_positions(in_RDI);
  begin_00 = (QString *)TVar4.begin;
  pQVar3 = (QString *)QString::cbegin((QString *)0x530e7d);
  if (begin_00 == pQVar3) {
    local_10 = (QString *)TVar4.end;
    pQVar3 = (QString *)QString::cend(in_RDI);
    if (local_10 == pQVar3) {
      QString::QString(in_RDI,local_10);
      goto LAB_00530f04;
    }
  }
  bVar2 = QString::isDetached((QString *)0x530ec4);
  if (bVar2) {
    trimmed_helper_inplace(in_RSI,(Char *)begin_00,(Char *)end);
  }
  else {
    QString::QString((QString *)TVar4.begin,(QChar *)unicode,(qsizetype)in_RSI);
  }
LAB_00530f04:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return end;
  }
  __stack_chk_fail();
}

Assistant:

static inline StringType trimmed_helper(StringType &str)
    {
        const auto [begin, end] = trimmed_helper_positions(str);
        if (begin == str.cbegin() && end == str.cend())
            return str;
        if (!isConst && str.isDetached())
            return trimmed_helper_inplace(str, begin, end);
        return StringType(begin, end - begin);
    }